

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O1

float diff_y(float (*floatpic) [512] [512],float *kernel,int x,int y,int n)

{
  long lVar1;
  float fVar2;
  
  if (-1 < n) {
    fVar2 = 0.0;
    lVar1 = 0;
    do {
      fVar2 = fVar2 + kernel[(lVar1 + 2) - (long)n] *
                      *(float *)((long)floatpic +
                                lVar1 * 4 + (long)x * 0x800 + (long)y * 4 + (long)n * -4 + 0x200000)
      ;
      lVar1 = lVar1 + 1;
    } while (n * 2 + 1 != (int)lVar1);
    return fVar2;
  }
  return 0.0;
}

Assistant:

float diff_y(
float floatpic[PIC_T][PIC_X][PIC_Y],
float kernel[5],
int x, int y, int n)
{
int i;
float sum;

sum = 0.0;
for(i=(-n);i<=n;i++)
	{
	sum += kernel[i+2]*floatpic[2][x][y+i];
	}
return(sum);
}